

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

char * cp_tok2str(CPState *cp,CPToken tok)

{
  CPToken tok_local;
  CPState *cp_local;
  
  if (tok < 0x100) {
    if ((""[(long)tok + 1] & 1) == 0) {
      cp_local = (CPState *)lj_strfmt_pushf(cp->L,"%c",(ulong)(uint)tok);
    }
    else {
      cp_local = (CPState *)lj_strfmt_pushf(cp->L,"char(%d)",(ulong)(uint)tok);
    }
  }
  else {
    cp_local = (CPState *)ctoknames[tok + -0x100];
  }
  return (char *)cp_local;
}

Assistant:

static const char *cp_tok2str(CPState *cp, CPToken tok)
{
  lj_assertCP(tok < CTOK_FIRSTDECL, "bad CPToken %d", tok);
  if (tok > CTOK_OFS)
    return ctoknames[tok-CTOK_OFS-1];
  else if (!lj_char_iscntrl(tok))
    return lj_strfmt_pushf(cp->L, "%c", tok);
  else
    return lj_strfmt_pushf(cp->L, "char(%d)", tok);
}